

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExceptionTranslatorRegistry::translateActiveException_abi_cxx11_
          (ExceptionTranslatorRegistry *this)

{
  value_type pIStack_c0;
  ExceptionTranslatorRegistry *pEStack_b8;
  undefined1 *puStack_b0;
  ExceptionTranslatorRegistry *local_78;
  ExceptionTranslatorRegistry *local_70;
  TestFailureException *anon_var_0;
  exception *ex;
  string *msg;
  char *msg_1;
  ExceptionTranslatorRegistry *this_local;
  
  puStack_b0 = (undefined1 *)0x188cab;
  local_78 = this;
  local_70 = this;
  this_local = this;
  __cxa_rethrow();
  pEStack_b8 = this;
  puStack_b0 = &stack0xfffffffffffffff8;
  std::
  vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
  ::push_back(&this->m_translators,&pIStack_c0);
  return;
}

Assistant:

virtual std::string translateActiveException() const {
            try {
#ifdef __OBJC__
                // In Objective-C try objective-c exceptions first
                @try {
                    throw;
                }
                @catch (NSException *exception) {
                    return Catch::toString( [exception description] );
                }
#else
                throw;
#endif
            }
            catch( TestFailureException& ) {
                throw;
            }
            catch( std::exception& ex ) {
                return ex.what();
            }
            catch( std::string& msg ) {
                return msg;
            }
            catch( const char* msg ) {
                return msg;
            }
            catch(...) {
                return tryTranslators( m_translators.begin() );
            }
        }